

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O3

void __thiscall AliHttpRequest::AliHttpRequest(AliHttpRequest *this,string *url)

{
  _Rb_tree_header *p_Var1;
  http_parser *phVar2;
  
  this->_vptr_AliHttpRequest = (_func_int **)&PTR_CommitRequest_001d3ad0;
  p_Var1 = &(this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header;
  (this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->map_reponse_headers_)._M_t._M_impl.super__Rb_tree_header;
  (this->map_reponse_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map_reponse_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->map_reponse_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->map_reponse_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->map_reponse_headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->method_)._M_dataplus._M_p = (pointer)&(this->method_).field_2;
  (this->method_)._M_string_length = 0;
  (this->method_).field_2._M_local_buf[0] = '\0';
  (this->url_)._M_dataplus._M_p = (pointer)&(this->url_).field_2;
  (this->url_)._M_string_length = 0;
  (this->url_).field_2._M_local_buf[0] = '\0';
  (this->query_)._M_dataplus._M_p = (pointer)&(this->query_).field_2;
  (this->query_)._M_string_length = 0;
  (this->query_).field_2._M_local_buf[0] = '\0';
  (this->flagment_)._M_dataplus._M_p = (pointer)&(this->flagment_).field_2;
  (this->flagment_)._M_string_length = 0;
  (this->flagment_).field_2._M_local_buf[0] = '\0';
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  (this->port_)._M_dataplus._M_p = (pointer)&(this->port_).field_2;
  (this->port_)._M_string_length = 0;
  (this->port_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  (this->sechema_)._M_dataplus._M_p = (pointer)&(this->sechema_).field_2;
  (this->sechema_)._M_string_length = 0;
  (this->sechema_).field_2._M_local_buf[0] = '\0';
  (this->resposne_body_)._M_dataplus._M_p = (pointer)&(this->resposne_body_).field_2;
  (this->resposne_body_)._M_string_length = 0;
  (this->resposne_body_).field_2._M_local_buf[0] = '\0';
  (this->proxy_host_)._M_dataplus._M_p = (pointer)&(this->proxy_host_).field_2;
  (this->proxy_host_)._M_string_length = 0;
  (this->proxy_host_).field_2._M_local_buf[0] = '\0';
  (this->last_response_field_)._M_dataplus._M_p = (pointer)&(this->last_response_field_).field_2;
  (this->last_response_field_)._M_string_length = 0;
  (this->last_response_field_).field_2._M_local_buf[0] = '\0';
  (this->last_response_value_)._M_dataplus._M_p = (pointer)&(this->last_response_value_).field_2;
  (this->last_response_value_)._M_string_length = 0;
  (this->last_response_value_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->method_,0,(char *)0x0,0x1a7d15);
  std::__cxx11::string::_M_replace
            ((ulong)&this->port_,0,(char *)(this->port_)._M_string_length,0x1a7d19);
  std::__cxx11::string::_M_assign((string *)&this->url_);
  this->is_tls = false;
  this->is_last_value_ = false;
  this->is_response_header_complete = false;
  this->is_response_complete = false;
  this->connection_ = (AliConnection *)0x0;
  phVar2 = (http_parser *)calloc(1,0x20);
  this->parser_ = phVar2;
  ParseUrl(this);
  return;
}

Assistant:

AliHttpRequest::AliHttpRequest(std::string url) {
  this->method_ = "GET";
  this->port_ = "80";
  this->url_ = url;
  this->is_tls = false;
  this->is_last_value_ = false;
  this->is_response_complete = false;
  this->is_response_header_complete = false;
  this->connection_ = NULL;
  parser_ = (http_parser*)calloc(1, sizeof(http_parser));
  this->ParseUrl();
}